

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

void parseConverterOptions
               (char *inName,UConverterNamePieces *pPieces,UConverterLoadArgs *pArgs,UErrorCode *err
               )

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  char *__s1;
  
  pArgs->name = inName;
  pcVar1 = pPieces->locale;
  pArgs->locale = pcVar1;
  pArgs->options = pPieces->options;
  for (lVar6 = 0; (cVar2 = inName[lVar6], cVar2 != '\0' && (cVar2 != ',')); lVar6 = lVar6 + 1) {
    if ((int)lVar6 == 0x3b) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      pPieces->cnvName[0] = '\0';
      return;
    }
    pPieces->cnvName[lVar6] = cVar2;
  }
  pPieces->cnvName[lVar6] = '\0';
  pArgs->name = pPieces->cnvName;
  pcVar3 = inName + lVar6;
  do {
    while( true ) {
      __s1 = pcVar3;
      if (*__s1 == ',') {
        __s1 = __s1 + 1;
      }
      else if (*__s1 == '\0') {
        return;
      }
      iVar4 = strncmp(__s1,"locale=",7);
      if (iVar4 == 0) break;
      iVar4 = strncmp(__s1,"version=",8);
      if (iVar4 == 0) {
        if (__s1[8] == '\0') {
          uVar5 = pPieces->options & 0xfffffff0;
          pPieces->options = uVar5;
          pArgs->options = uVar5;
          return;
        }
        uVar5 = (int)__s1[8] - 0x30;
        pcVar3 = __s1 + 8;
        if ((uVar5 & 0xfe) < 10) {
          uVar5 = pPieces->options & 0xfffffff0 | uVar5;
          pPieces->options = uVar5;
          pArgs->options = uVar5;
          pcVar3 = __s1 + 9;
        }
      }
      else {
        iVar4 = strncmp(__s1,"swaplfnl",8);
        if (iVar4 == 0) {
          uVar5 = pPieces->options | 0x10;
          pPieces->options = uVar5;
          pArgs->options = uVar5;
          pcVar3 = __s1 + 8;
        }
        else {
          while( true ) {
            cVar2 = *__s1;
            __s1 = __s1 + 1;
            pcVar3 = __s1;
            if (cVar2 == ',') break;
            if (cVar2 == '\0') {
              return;
            }
          }
        }
      }
    }
    lVar6 = 0;
    for (lVar7 = 0; (cVar2 = __s1[lVar7 + 7], cVar2 != '\0' && (cVar2 != ',')); lVar7 = lVar7 + 1) {
      if ((int)lVar7 == 0x9c) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        *pcVar1 = '\0';
        lVar6 = 8 - lVar6;
        goto LAB_001626c6;
      }
      pcVar1[lVar7] = cVar2;
      lVar6 = lVar6 + -1;
    }
    pcVar1[lVar7] = '\0';
    lVar6 = 7 - lVar6;
LAB_001626c6:
    pcVar3 = __s1 + lVar6;
    if ((cVar2 != '\0') && (cVar2 != ',')) {
      return;
    }
  } while( true );
}

Assistant:

static void
parseConverterOptions(const char *inName,
                      UConverterNamePieces *pPieces,
                      UConverterLoadArgs *pArgs,
                      UErrorCode *err)
{
    char *cnvName = pPieces->cnvName;
    char c;
    int32_t len = 0;

    pArgs->name=inName;
    pArgs->locale=pPieces->locale;
    pArgs->options=pPieces->options;

    /* copy the converter name itself to cnvName */
    while((c=*inName)!=0 && c!=UCNV_OPTION_SEP_CHAR) {
        if (++len>=UCNV_MAX_CONVERTER_NAME_LENGTH) {
            *err = U_ILLEGAL_ARGUMENT_ERROR;    /* bad name */
            pPieces->cnvName[0]=0;
            return;
        }
        *cnvName++=c;
        inName++;
    }
    *cnvName=0;
    pArgs->name=pPieces->cnvName;

    /* parse options. No more name copying should occur. */
    while((c=*inName)!=0) {
        if(c==UCNV_OPTION_SEP_CHAR) {
            ++inName;
        }

        /* inName is behind an option separator */
        if(uprv_strncmp(inName, "locale=", 7)==0) {
            /* do not modify locale itself in case we have multiple locale options */
            char *dest=pPieces->locale;

            /* copy the locale option value */
            inName+=7;
            len=0;
            while((c=*inName)!=0 && c!=UCNV_OPTION_SEP_CHAR) {
                ++inName;

                if(++len>=ULOC_FULLNAME_CAPACITY) {
                    *err=U_ILLEGAL_ARGUMENT_ERROR;    /* bad name */
                    pPieces->locale[0]=0;
                    return;
                }

                *dest++=c;
            }
            *dest=0;
        } else if(uprv_strncmp(inName, "version=", 8)==0) {
            /* copy the version option value into bits 3..0 of pPieces->options */
            inName+=8;
            c=*inName;
            if(c==0) {
                pArgs->options=(pPieces->options&=~UCNV_OPTION_VERSION);
                return;
            } else if((uint8_t)(c-'0')<10) {
                pArgs->options=pPieces->options=(pPieces->options&~UCNV_OPTION_VERSION)|(uint32_t)(c-'0');
                ++inName;
            }
        } else if(uprv_strncmp(inName, "swaplfnl", 8)==0) {
            inName+=8;
            pArgs->options=(pPieces->options|=UCNV_OPTION_SWAP_LFNL);
        /* add processing for new options here with another } else if(uprv_strncmp(inName, "option-name=", XX)==0) { */
        } else {
            /* ignore any other options until we define some */
            while(((c = *inName++) != 0) && (c != UCNV_OPTION_SEP_CHAR)) {
            }
            if(c==0) {
                return;
            }
        }
    }
}